

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form3_Histogram(HistogramForm3 Histogram)

{
  uint *puVar1;
  byte value;
  uint uVar2;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image input;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,(ImageTemplate<unsigned_char> *)&histogram);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  (*Histogram)(&histogram,&input,roiX,roiY,roiWidth,roiHeight);
  if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x400) {
    puVar1 = histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + value;
    uVar2 = 0;
    if (*puVar1 == roiHeight * roiWidth) {
      for (; histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start !=
             histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
          histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        uVar2 = uVar2 + *histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      }
      uVar2 = (uint)(uVar2 == *puVar1);
    }
  }
  else {
    uVar2 = 0;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return SUB41(uVar2,0);
}

Assistant:

bool form3_Histogram(HistogramForm3 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const std::vector < uint32_t > histogram = Histogram( input, roiX, roiY, roiWidth, roiHeight );

        return histogram.size() == 256u && histogram[intensity] == roiWidth * roiHeight &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * roiHeight;
    }